

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection_manager.cpp
# Opt level: O1

vector<duckdb::shared_ptr<duckdb::ClientContext,_true>,_true> * __thiscall
duckdb::ConnectionManager::GetConnectionList
          (vector<duckdb::shared_ptr<duckdb::ClientContext,_true>,_true> *__return_storage_ptr__,
          ConnectionManager *this)

{
  int iVar1;
  _Hash_node_base *p_Var2;
  shared_ptr<duckdb::ClientContext,_true> sVar3;
  shared_ptr<duckdb::ClientContext,_true> connection;
  shared_ptr<duckdb::ClientContext,_true> local_38;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar1 == 0) {
    (__return_storage_ptr__->
    super_vector<duckdb::shared_ptr<duckdb::ClientContext,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ClientContext,_true>_>_>
    ).
    super__Vector_base<duckdb::shared_ptr<duckdb::ClientContext,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ClientContext,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super_vector<duckdb::shared_ptr<duckdb::ClientContext,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ClientContext,_true>_>_>
    ).
    super__Vector_base<duckdb::shared_ptr<duckdb::ClientContext,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ClientContext,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super_vector<duckdb::shared_ptr<duckdb::ClientContext,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ClientContext,_true>_>_>
    ).
    super__Vector_base<duckdb::shared_ptr<duckdb::ClientContext,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ClientContext,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    p_Var2 = (this->connections)._M_h._M_before_begin._M_nxt;
    if (p_Var2 != (_Hash_node_base *)0x0) {
      do {
        sVar3 = weak_ptr<duckdb::ClientContext,_true>::lock
                          ((weak_ptr<duckdb::ClientContext,_true> *)&local_38);
        if (local_38.internal.super___shared_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr == (element_type *)0x0) {
          ::std::
          _Hashtable<std::reference_wrapper<duckdb::ClientContext>,_std::pair<const_std::reference_wrapper<duckdb::ClientContext>,_duckdb::weak_ptr<duckdb::ClientContext,_true>_>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::ClientContext>,_duckdb::weak_ptr<duckdb::ClientContext,_true>_>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<duckdb::ClientContext>,_duckdb::ReferenceHashFunction<duckdb::ClientContext>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::_M_erase(&(this->connections)._M_h,p_Var2 + 1,
                     sVar3.internal.
                     super___shared_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
          LOCK();
          (this->connection_count).super___atomic_base<unsigned_long>._M_i =
               (this->connections)._M_h._M_element_count;
          UNLOCK();
        }
        else {
          ::std::
          vector<duckdb::shared_ptr<duckdb::ClientContext,true>,std::allocator<duckdb::shared_ptr<duckdb::ClientContext,true>>>
          ::emplace_back<duckdb::shared_ptr<duckdb::ClientContext,true>>
                    ((vector<duckdb::shared_ptr<duckdb::ClientContext,true>,std::allocator<duckdb::shared_ptr<duckdb::ClientContext,true>>>
                      *)__return_storage_ptr__,&local_38);
        }
        if (local_38.internal.super___shared_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_38.internal.
                     super___shared_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        p_Var2 = p_Var2->_M_nxt;
      } while (p_Var2 != (_Hash_node_base *)0x0);
    }
    pthread_mutex_unlock((pthread_mutex_t *)this);
    return __return_storage_ptr__;
  }
  ::std::__throw_system_error(iVar1);
}

Assistant:

vector<shared_ptr<ClientContext>> ConnectionManager::GetConnectionList() {
	lock_guard<mutex> lock(connections_lock);
	vector<shared_ptr<ClientContext>> result;
	for (auto &it : connections) {
		auto connection = it.second.lock();
		if (!connection) {
			connections.erase(it.first);
			connection_count = connections.size();
			continue;
		} else {
			result.push_back(std::move(connection));
		}
	}

	return result;
}